

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall DReachabilityPropagator::remove_deg1(DReachabilityPropagator *this,int u)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Lit LVar5;
  uint *puVar6;
  reference piVar7;
  ulong uVar8;
  reference pvVar9;
  size_type sVar10;
  reference pvVar11;
  BoolView *this_00;
  DReachabilityPropagator *pDVar12;
  uint in_ESI;
  DReachabilityPropagator *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  Clause *expl_2;
  vec<Lit> psfail_1;
  int oe_1;
  uint i;
  vec<Lit> ps_1;
  Clause *r_1;
  Clause *expl_1;
  int ie;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  vec<Lit> ps_in_fail;
  vec<Lit> ps_in;
  int in_deg;
  Clause *expl;
  vec<Lit> psfail;
  vec<Lit> ps;
  int other;
  int oe;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  vec<Lit> ps_out;
  int last_seen;
  int out_deg;
  Clause *r;
  BoolView *in_stack_fffffffffffffb98;
  DReachabilityPropagator *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  undefined1 uVar14;
  BoolView *in_stack_fffffffffffffbc0;
  vec<Lit> local_1c0;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  Reason local_1a0;
  value_type local_194;
  uint local_190;
  int local_18c;
  vec<Lit> local_188;
  _Base_ptr local_178;
  undefined1 local_170;
  Reason local_168;
  int local_15c;
  Clause *local_158;
  Clause *local_150;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int *local_130;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_128;
  reference local_120;
  vec<Lit> local_118;
  vec<Lit> local_108;
  int local_f4;
  Clause *local_f0;
  int local_e4;
  vec<Lit> local_e0;
  _Base_ptr local_d0;
  undefined1 local_c8;
  int local_bc;
  Reason local_b8;
  int local_ac;
  vec<Lit> local_a8;
  _Base_ptr local_98;
  undefined1 local_90;
  int local_84;
  Reason local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  int *local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  reference local_50;
  vec<Lit> local_38;
  uint local_28;
  int local_24;
  Clause *local_20;
  uint local_14;
  byte local_1;
  
  local_14 = in_ESI;
  GraphPropagator::getNodeVar
            (&in_stack_fffffffffffffba0->super_GraphPropagator,
             (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  bVar1 = BoolView::isFixed((BoolView *)0x2abdaa);
  if (bVar1) {
    GraphPropagator::getNodeVar
              (&in_stack_fffffffffffffba0->super_GraphPropagator,
               (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    bVar1 = BoolView::isFalse((BoolView *)in_stack_fffffffffffffba0);
    if (bVar1) {
      local_1 = 1;
      goto LAB_002ad26f;
    }
  }
  uVar4 = local_14;
  uVar2 = get_root_idx(in_RDI);
  if ((uVar4 == uVar2) && (1 < in_RDI->in_nodes_size)) {
    local_20 = (Clause *)0x0;
    local_24 = 0;
    local_28 = 0xffffffff;
    vec<Lit>::vec(&local_38);
    if ((so.lazy & 1U) != 0) {
      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffba0);
    }
    iVar3 = get_root_idx(in_RDI);
    local_50 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&in_RDI->ou,(long)iVar3);
    local_58._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb98);
    local_60 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffba0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffb98), bVar1) {
      puVar6 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_58);
      local_64 = *puVar6;
      GraphPropagator::getEdgeVar
                (&in_stack_fffffffffffffba0->super_GraphPropagator,
                 (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x2abf45);
      if (bVar1) {
        GraphPropagator::getEdgeVar
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffba0);
        if (bVar1) goto LAB_002abf9c;
        if ((so.lazy & 1U) != 0) {
          GraphPropagator::getEdgeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          local_68 = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                         (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        }
      }
      else {
LAB_002abf9c:
        local_24 = local_24 + 1;
        local_28 = local_64;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_58);
    }
    if ((local_24 == 1) && (1 < in_RDI->in_nodes_size)) {
      GraphPropagator::getEdgeVar
                (&in_stack_fffffffffffffba0->super_GraphPropagator,
                 (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x2ac089);
      if (bVar1) goto LAB_002ac72a;
      if ((so.lazy & 1U) != 0) {
        local_6c = get_some_innode_not((DReachabilityPropagator *)
                                       CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)
                                       ,(int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
        get_root_idx(in_RDI);
        GraphPropagator::getNodeVar
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        local_70 = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
        vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                       (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        GraphPropagator::getNodeVar
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        local_74 = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
        vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                       (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        local_20 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffba0);
      }
      GraphPropagator::getEdgeVar
                (&in_stack_fffffffffffffba0->super_GraphPropagator,
                 (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      Reason::Reason(&local_80,local_20);
      BoolView::setVal((BoolView *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                       SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
                       (Reason)in_stack_fffffffffffffbb0);
      uVar4 = (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])
                        (in_RDI,(ulong)local_28);
      if ((uVar4 & 1) == 0) {
        local_1 = 0;
        local_84 = 1;
      }
      else {
        Tint::operator=((Tint *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
        pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            in_stack_fffffffffffffbc0,
                            (value_type_conflict *)
                            CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        local_98 = (_Base_ptr)pVar13.first._M_node;
        local_90 = pVar13.second;
        GraphPropagator::getHead
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        GraphPropagator::getNodeVar
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        bVar1 = BoolView::isFixed((BoolView *)0x2ac301);
        if (bVar1) {
          GraphPropagator::getHead
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          GraphPropagator::getNodeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          bVar1 = BoolView::isFalse((BoolView *)in_stack_fffffffffffffba0);
          if (bVar1) {
            if ((so.lazy & 1U) != 0) {
              vec<Lit>::vec(&local_e0);
              GraphPropagator::getEdgeVar
                        (&in_stack_fffffffffffffba0->super_GraphPropagator,
                         (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
              local_e4 = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
              vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                             (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              local_f0 = ::Clause_new<vec<Lit>>
                                   ((vec<Lit> *)in_stack_fffffffffffffbc0,
                                    SUB41((uint)in_stack_fffffffffffffbbc >> 0x18,0));
              *(uint *)local_f0 = *(uint *)local_f0 | 2;
              vec<vec<Clause_*>_>::last(&sat.rtrail);
              vec<Clause_*>::push((vec<Clause_*> *)in_stack_fffffffffffffbb0._pt,
                                  (Clause **)
                                  CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              sat.confl = local_f0;
              vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffba0);
            }
            local_1 = 0;
            local_84 = 1;
            goto LAB_002ac735;
          }
        }
        else {
          if ((so.lazy & 1U) != 0) {
            vec<Lit>::vec(&local_a8);
            vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffba0);
            GraphPropagator::getEdgeVar
                      (&in_stack_fffffffffffffba0->super_GraphPropagator,
                       (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
            local_ac = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
            vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                           (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            local_20 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffba0);
            vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffba0);
          }
          GraphPropagator::getHead
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          GraphPropagator::getNodeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          Reason::Reason(&local_b8,local_20);
          BoolView::setVal((BoolView *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                           ,SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
                           (Reason)in_stack_fffffffffffffbb0);
          GraphPropagator::getHead
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          Tint::operator=((Tint *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
          GraphPropagator::getHead
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          add_innode(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          local_bc = GraphPropagator::getHead
                               (&in_stack_fffffffffffffba0->super_GraphPropagator,
                                (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              in_stack_fffffffffffffbc0,
                              (value_type_conflict *)
                              CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
          local_d0 = (_Base_ptr)pVar13.first._M_node;
          local_c8 = pVar13.second;
        }
        local_1 = 1;
        local_84 = 1;
      }
    }
    else {
LAB_002ac72a:
      local_84 = 0;
    }
LAB_002ac735:
    vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffba0);
    if (local_84 != 0) goto LAB_002ad26f;
  }
  uVar4 = local_14;
  uVar2 = get_root_idx(in_RDI);
  if (uVar4 != uVar2) {
    local_f4 = 0;
    vec<Lit>::vec(&local_108);
    vec<Lit>::vec(&local_118);
    if ((so.lazy & 1U) != 0) {
      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffba0);
    }
    local_120 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&in_RDI->in,(long)(int)local_14);
    local_128._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb98);
    local_130 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffba0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffb98), bVar1) {
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_128);
      local_134 = *piVar7;
      GraphPropagator::getEdgeVar
                (&in_stack_fffffffffffffba0->super_GraphPropagator,
                 (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x2ac8b8);
      if (bVar1) {
        GraphPropagator::getEdgeVar
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffba0);
        if (bVar1) goto LAB_002ac90f;
        if ((so.lazy & 1U) != 0) {
          GraphPropagator::getEdgeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          local_138 = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                         (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          GraphPropagator::getEdgeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          local_13c = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                         (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        }
      }
      else {
LAB_002ac90f:
        local_f4 = local_f4 + 1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_128);
    }
    if (local_f4 < 1) {
      GraphPropagator::getNodeVar
                (&in_stack_fffffffffffffba0->super_GraphPropagator,
                 (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x2aca4d);
      if (bVar1) {
        GraphPropagator::getNodeVar
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffba0);
        if (bVar1) {
          if ((so.lazy & 1U) != 0) {
            GraphPropagator::getNodeVar
                      (&in_stack_fffffffffffffba0->super_GraphPropagator,
                       (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
            uVar14 = (undefined1)((uint)in_stack_fffffffffffffbbc >> 0x18);
            local_140 = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
            vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                           (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            get_root_idx(in_RDI);
            GraphPropagator::getNodeVar
                      (&in_stack_fffffffffffffba0->super_GraphPropagator,
                       (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
            local_144 = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
            vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                           (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            local_150 = ::Clause_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffbc0,(bool)uVar14);
            *(uint *)local_150 = *(uint *)local_150 | 2;
            vec<vec<Clause_*>_>::last(&sat.rtrail);
            vec<Clause_*>::push((vec<Clause_*> *)in_stack_fffffffffffffbb0._pt,
                                (Clause **)
                                CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            sat.confl = local_150;
          }
          local_1 = 0;
          local_84 = 1;
          goto LAB_002ad220;
        }
      }
      local_158 = (Clause *)0x0;
      GraphPropagator::getNodeVar
                (&in_stack_fffffffffffffba0->super_GraphPropagator,
                 (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x2acc46);
      if (!bVar1) {
        if ((so.lazy & 1U) != 0) {
          get_root_idx(in_RDI);
          GraphPropagator::getNodeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          local_15c = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                         (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          local_158 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffba0);
        }
        GraphPropagator::getNodeVar
                  (&in_stack_fffffffffffffba0->super_GraphPropagator,
                   (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        Reason::Reason(&local_168,local_158);
        BoolView::setVal((BoolView *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
                         (Reason)in_stack_fffffffffffffbb0);
        uVar4 = (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                          (in_RDI,(ulong)local_14);
        if ((uVar4 & 1) == 0) {
          local_1 = 0;
          local_84 = 1;
          goto LAB_002ad220;
        }
        Tint::operator=((Tint *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
        pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            in_stack_fffffffffffffbc0,
                            (value_type_conflict *)
                            CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        local_178 = (_Base_ptr)pVar13.first._M_node;
        local_170 = pVar13.second;
        if ((so.lazy & 1U) != 0) {
          vec<Lit>::vec(&local_188);
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffba0);
          GraphPropagator::getNodeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          local_18c = (int)BoolView::getValLit(in_stack_fffffffffffffb98);
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffbb0._pt,
                         (Lit *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          local_158 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffba0);
          vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffba0);
        }
        local_190 = 0;
        while( true ) {
          uVar8 = (ulong)local_190;
          pvVar9 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&in_RDI->ou,(long)(int)local_14);
          sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar9);
          if (sVar10 <= uVar8) break;
          pvVar9 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&in_RDI->ou,(long)(int)local_14);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(ulong)local_190);
          local_194 = *pvVar11;
          uVar4 = GraphPropagator::getHead
                            (&in_stack_fffffffffffffba0->super_GraphPropagator,
                             (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          uVar4 = (*(in_RDI->super_GraphPropagator).super_Propagator._vptr_Propagator[0xe])
                            (in_RDI,(ulong)uVar4);
          if ((uVar4 & 1) == 0) {
            local_1 = 0;
            local_84 = 1;
            goto LAB_002ad220;
          }
          GraphPropagator::getEdgeVar
                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          bVar1 = BoolView::isFixed((BoolView *)0x2acfd2);
          iVar3 = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
          if (bVar1) {
            in_stack_fffffffffffffbc0 =
                 GraphPropagator::getEdgeVar
                           (&in_stack_fffffffffffffba0->super_GraphPropagator,iVar3);
            bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffba0);
            in_stack_fffffffffffffbbc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbbc);
            if (bVar1) {
              if ((so.lazy & 1U) != 0) {
                vec<Lit>::vec(&local_1c0);
                uVar14 = (undefined1)((uint)in_stack_fffffffffffffbbc >> 0x18);
                this_00 = GraphPropagator::getNodeVar
                                    (&in_stack_fffffffffffffba0->super_GraphPropagator,
                                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
                LVar5 = BoolView::getValLit(in_stack_fffffffffffffb98);
                vec<Lit>::push((vec<Lit> *)this_00,
                               (Lit *)CONCAT44(LVar5.x,in_stack_fffffffffffffba8));
                pDVar12 = (DReachabilityPropagator *)
                          ::Clause_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffbc0,(bool)uVar14)
                ;
                *(uint *)&(pDVar12->super_GraphPropagator).super_Propagator._vptr_Propagator =
                     *(uint *)&(pDVar12->super_GraphPropagator).super_Propagator._vptr_Propagator |
                     2;
                in_stack_fffffffffffffba0 = pDVar12;
                vec<vec<Clause_*>_>::last(&sat.rtrail);
                vec<Clause_*>::push((vec<Clause_*> *)this_00,
                                    (Clause **)CONCAT44(LVar5.x,in_stack_fffffffffffffba8));
                sat.confl = (Clause *)pDVar12;
                vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffba0);
              }
              local_1 = 0;
              local_84 = 1;
              goto LAB_002ad220;
            }
          }
          else {
            GraphPropagator::getEdgeVar(&in_stack_fffffffffffffba0->super_GraphPropagator,iVar3);
            Reason::Reason(&local_1a0,local_158);
            BoolView::setVal((BoolView *)
                             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                             SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
                             (Reason)in_stack_fffffffffffffbb0);
            Tint::operator=((Tint *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
            pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                in_stack_fffffffffffffbc0,
                                (value_type_conflict *)
                                CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
            local_1b0 = (_Base_ptr)pVar13.first._M_node;
            local_1a8 = pVar13.second;
          }
          local_190 = local_190 + 1;
        }
      }
      local_84 = 0;
    }
    else {
      local_1 = 1;
      local_84 = 1;
    }
LAB_002ad220:
    vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffba0);
    vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffba0);
    if (local_84 != 0) goto LAB_002ad26f;
  }
  local_1 = 1;
LAB_002ad26f:
  return (bool)(local_1 & 1);
}

Assistant:

bool DReachabilityPropagator::remove_deg1(int u) {
	if (DEBUG) {
		std::cout << "Remove deg1 from " << u << '\n';
	}
	if (getNodeVar(u).isFixed() && getNodeVar(u).isFalse()) {
		return true;
	}

	if (u == get_root_idx() && in_nodes_size > 1) {
		Clause* r = nullptr;
		int out_deg = 0;
		int last_seen = -1;
		vec<Lit> ps_out;
		if (so.lazy) {
			ps_out.push();
		}
		for (const int oe : ou[get_root_idx()]) {
			if (!getEdgeVar(oe).isFixed() || getEdgeVar(oe).isTrue()) {
				out_deg++;
				last_seen = oe;
			} else if (so.lazy) {
				ps_out.push(getEdgeVar(oe).getValLit());
			}
		}
		if (out_deg == 1 && in_nodes_size > 1 && !getEdgeVar(last_seen).isFixed()) {
			if (so.lazy) {
				const int other = get_some_innode_not(u);
				assert(other != -1);
				ps_out.push(getNodeVar(get_root_idx()).getValLit());
				ps_out.push(getNodeVar(other).getValLit());
				r = Reason_new(ps_out);
			}
			getEdgeVar(last_seen).setVal(true, r);
			if (!propagateNewEdge(last_seen)) {
				return false;
			}
			last_state_e[last_seen] = VT_IN;
			new_edge.insert(last_seen);
			if (DEBUG) {
				std::cout << "Edge in " << last_seen << '\n';
			}
			// Propagate New Edge already does this.
			// We enforce the other extremity if not there yet:
			//*
			if (!getNodeVar(getHead(last_seen)).isFixed()) {
				if (so.lazy) {
					vec<Lit> ps;
					ps.push();
					ps.push(getEdgeVar(last_seen).getValLit());
					r = Reason_new(ps);
				}
				getNodeVar(getHead(last_seen)).setVal(true, r);
				last_state_n[getHead(last_seen)] = VT_IN;
				add_innode(getHead(last_seen));
				new_node.insert(getHead(last_seen));
				if (DEBUG) {
					std::cout << "Node in " << getHead(last_seen) << '\n';
				}
			} else if (getNodeVar(getHead(last_seen)).isFalse()) {
				if (so.lazy) {
					vec<Lit> psfail;
					psfail.push(getEdgeVar(last_seen).getValLit());
					Clause* expl = Clause_new(psfail);
					expl->temp_expl = 1;
					sat.rtrail.last().push(expl);
					sat.confl = expl;
				}
				if (DEBUG) {
					std::cout << "False " << __FILE__ << __LINE__ << '\n';
				}
				return false;
			}  //*/

			return true;
		}
	}

	if (u != get_root_idx()) {
		int in_deg = 0;
		vec<Lit> ps_in;
		vec<Lit> ps_in_fail;
		if (so.lazy) {
			ps_in.push();
		}

		for (const int ie : in[u]) {
			if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
				in_deg++;
			} else if (so.lazy) {
				ps_in.push(getEdgeVar(ie).getValLit());
				ps_in_fail.push(getEdgeVar(ie).getValLit());
			}
		}

		if (in_deg > 0) {
			return true;
		}

		if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
			// Fail because no way to get to this node
			if (so.lazy) {
				ps_in_fail.push(getNodeVar(u).getValLit());
				ps_in_fail.push(getNodeVar(get_root_idx()).getValLit());
				Clause* expl = Clause_new(ps_in_fail);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			if (DEBUG) {
				std::cout << "False " << u << " " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		Clause* r = nullptr;
		if (!getNodeVar(u).isFixed()) {
			// Force the node to be out.
			if (so.lazy) {
				ps_in.push(getNodeVar(get_root_idx()).getValLit());
				r = Reason_new(ps_in);
			}
			getNodeVar(u).setVal(false, r);
			if (!propagateRemNode(u)) {
				return false;
			}
			last_state_n[u] = VT_OUT;
			rem_node.insert(u);
			if (DEBUG) {
				std::cout << "Node out " << u << '\n';
			}
			//*
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(u).getValLit());
				r = Reason_new(ps);
			}  //*/
			for (unsigned int i = 0; i < ou[u].size(); i++) {
				const int oe = ou[u][i];
				if (!remove_deg1(getHead(oe))) {
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}
				// Done by PropagateRemNode
				//*
				if (!getEdgeVar(oe).isFixed()) {
					getEdgeVar(oe).setVal(false, r);
					last_state_e[oe] = VT_OUT;
					rem_edge.insert(oe);
					if (DEBUG) {
						std::cout << "Edge out " << oe << '\n';
					}

				} else if (getEdgeVar(oe).isTrue()) {
					if (so.lazy) {
						vec<Lit> psfail;
						psfail.push(getNodeVar(u).getValLit());
						Clause* expl = Clause_new(psfail);
						expl->temp_expl = 1;
						sat.rtrail.last().push(expl);
						sat.confl = expl;
					}
					if (DEBUG) {
						std::cout << "False " << __FILE__ << __LINE__ << '\n';
					}
					return false;
				}  //*/
			}
		}
	}

	return true;
}